

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O3

iterator_range<burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>_>
* __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,vector<char,_std::allocator<char>_> *args
          ,int *args_1)

{
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
  begin;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
  bStack_a8;
  char *local_78;
  char *pcStack_70;
  difference_type local_68;
  element_type *local_60;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
  *local_58;
  buffer_value_type *local_50;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
  local_48;
  
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
  ::buffered_chunk_iterator
            (&bStack_a8,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (args->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (args->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish,*args_1);
  local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
       *)bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
       *)0x0) {
    local_58 = (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
                *)0x0;
  }
  else {
    local_58 = (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
                *)bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
               &(bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count)->_M_current =
           *(int *)&((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                    &(bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_current + 1;
      UNLOCK();
    }
    else {
      *(int *)&((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
               &(bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count)->_M_current =
           *(int *)&((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                    &(bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_current + 1;
    }
  }
  local_68 = bStack_a8.m_chunk_size;
  local_78 = bStack_a8.m_current._M_current;
  pcStack_70 = bStack_a8.m_end._M_current;
  local_60 = bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50 = bStack_a8.m_chunk_end;
  local_48.m_current._M_current = bStack_a8.m_end._M_current;
  local_48.m_end._M_current = bStack_a8.m_end._M_current;
  local_48.m_chunk_size = bStack_a8.m_chunk_size;
  local_48.m_chunk_end =
       local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  boost::
  make_iterator_range<burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,int>>
            (__return_storage_ptr__,(boost *)&local_78,&local_48,
             (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
              *)local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi);
  if ((buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
       *)local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_58 !=
      (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_int>
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
  }
  if (bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (bStack_a8.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }